

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerWrite(PgHdr *pPg)

{
  uint uVar1;
  Pager *pPVar2;
  sqlite3_file *psVar3;
  void *pvVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  DbPage *pPg_00;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  Pgno pgno;
  sqlite3_vfs *psVar13;
  int iVar14;
  long lVar15;
  u32 i;
  long lVar16;
  int iVar17;
  int *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  DbPage *pDStack_40;
  undefined8 uStack_38;
  
  pPVar2 = pPg->pPager;
  if (((pPg->flags & 4) != 0) &&
     (uStack_38 = (PgHdr *)(ulong)pPVar2->dbSize, pPg->pgno <= pPVar2->dbSize)) {
    if (pPVar2->nSavepoint == 0) {
      return 0;
    }
    pPVar2 = pPg->pPager;
    iVar9 = pPVar2->nSavepoint;
    lVar15 = (long)iVar9;
    if (0 < lVar15) {
      uVar12 = pPg->pgno;
      piVar18 = &pPVar2->aSavepoint[4].bTruncateOnRelease;
      lVar16 = 0;
      do {
        if (uVar12 <= (uint)piVar18[-0x3a]) {
          pDStack_40 = (DbPage *)0x12d284;
          iVar14 = sqlite3BitvecTestNotNull(*(Bitvec **)(piVar18 + -0x3c),uVar12);
          auVar8 = _DAT_001c0520;
          auVar7 = _DAT_001c0510;
          auVar6 = _DAT_001c0500;
          if (iVar14 == 0) {
            if (1 - (int)lVar16 < iVar9) {
              lVar10 = lVar15 + lVar16 + -2;
              auVar19._8_4_ = (int)lVar10;
              auVar19._0_8_ = lVar10;
              auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
              uVar11 = 0;
              auVar19 = auVar19 ^ _DAT_001c0520;
              do {
                auVar20._8_4_ = (int)uVar11;
                auVar20._0_8_ = uVar11;
                auVar20._12_4_ = (int)(uVar11 >> 0x20);
                auVar21 = (auVar20 | auVar7) ^ auVar8;
                iVar9 = auVar19._4_4_;
                if ((bool)(~(auVar21._4_4_ == iVar9 && auVar19._0_4_ < auVar21._0_4_ ||
                            iVar9 < auVar21._4_4_) & 1)) {
                  piVar18[-0x2a] = 0;
                }
                if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
                    auVar21._12_4_ <= auVar19._12_4_) {
                  piVar18[-0x1c] = 0;
                }
                auVar20 = (auVar20 | auVar6) ^ auVar8;
                iVar14 = auVar20._4_4_;
                if (iVar14 <= iVar9 && (iVar14 != iVar9 || auVar20._0_4_ <= auVar19._0_4_)) {
                  piVar18[-0xe] = 0;
                  *piVar18 = 0;
                }
                uVar11 = uVar11 + 4;
                piVar18 = piVar18 + 0x38;
              } while ((lVar15 + lVar16 + 2U & 0xfffffffffffffffc) != uVar11);
            }
            iVar9 = sqlite3Config.nStmtSpill;
            if (pPVar2->journalMode == '\x02') goto LAB_0012d3c4;
            psVar3 = pPVar2->sjfd;
            if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
              if ((pPVar2->journalMode == '\x04') || (pPVar2->subjInMemory != '\0')) {
                psVar13 = pPVar2->pVfs;
                *(undefined1 (*) [16])(psVar3 + 6) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(psVar3 + 4) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(psVar3 + 2) = (undefined1  [16])0x0;
                iVar9 = -1;
                iVar14 = 0x3f8;
              }
              else {
                psVar13 = pPVar2->pVfs;
                *(undefined1 (*) [16])(psVar3 + 8) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(psVar3 + 6) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(psVar3 + 4) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(psVar3 + 2) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])psVar3 = (undefined1  [16])0x0;
                if (iVar9 == 0) {
                  pDStack_40 = (DbPage *)0x12d4dc;
                  iVar9 = (*psVar13->xOpen)((sqlite3_file *)psVar13,0);
                  if (iVar9 != 0) {
                    return iVar9;
                  }
                  goto LAB_0012d431;
                }
                iVar14 = 0x3f8;
                if (0 < iVar9) {
                  iVar14 = iVar9;
                }
              }
              *(int *)&psVar3[1].pMethods = iVar14;
              psVar3->pMethods = &MemJournalMethods;
              *(int *)((long)&psVar3[1].pMethods + 4) = iVar9;
              *(undefined4 *)&psVar3[7].pMethods = 0x201e;
              psVar3[9].pMethods = (sqlite3_io_methods *)0x0;
              psVar3[8].pMethods = (sqlite3_io_methods *)psVar13;
            }
LAB_0012d431:
            pvVar4 = pPg->pData;
            lVar15 = (pPVar2->pageSize + 4) * (ulong)pPVar2->nSubRec;
            uVar12 = pPg->pgno;
            uStack_38 = (PgHdr *)CONCAT44(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 |
                                          (uVar12 & 0xff00) << 8 | uVar12 << 0x18,
                                          (undefined4)uStack_38);
            pDStack_40 = (DbPage *)0x12d466;
            iVar9 = (*pPVar2->sjfd->pMethods->xWrite)
                              (pPVar2->sjfd,(void *)((long)&uStack_38 + 4),4,lVar15);
            if (iVar9 != 0) {
              return iVar9;
            }
            pDStack_40 = (DbPage *)0x12d488;
            iVar9 = (*pPVar2->sjfd->pMethods->xWrite)
                              (pPVar2->sjfd,pvVar4,(int)pPVar2->pageSize,lVar15 + 4);
            if (iVar9 != 0) {
              return iVar9;
            }
            uVar12 = pPg->pgno;
LAB_0012d3c4:
            pPVar2->nSubRec = pPVar2->nSubRec + 1;
            pDStack_40 = (DbPage *)0x12d3d1;
            iVar9 = addToSavepointBitvecs(pPVar2,uVar12);
            return iVar9;
          }
        }
        piVar18 = piVar18 + 0xe;
        lVar16 = lVar16 + -1;
      } while (lVar15 + lVar16 != 0);
    }
    return 0;
  }
  if (pPVar2->errCode != 0) {
    return pPVar2->errCode;
  }
  if (pPVar2->sectorSize <= (uint)pPVar2->pageSize) {
    iVar9 = pager_write(pPg);
    return iVar9;
  }
  pPVar2 = pPg->pPager;
  uVar12 = pPVar2->dbSize;
  pPVar2->doNotSpill = pPVar2->doNotSpill | 4;
  uVar1 = pPg->pgno;
  iVar9 = SUB164(ZEXT416(pPVar2->sectorSize) / SEXT816(pPVar2->pageSize),0);
  pgno = -iVar9 & uVar1 - 1;
  if (uVar12 < uVar1) {
    iVar14 = uVar1 - pgno;
  }
  else {
    iVar14 = uVar12 - pgno;
    if (pgno + iVar9 <= uVar12) {
      iVar14 = iVar9;
    }
  }
  if (iVar14 < 1) {
    iVar9 = 0;
  }
  else {
    bVar5 = false;
    iVar17 = 1;
    uStack_38 = pPg;
    do {
      i = pgno + iVar17;
      if (((i == uStack_38->pgno) || (pPVar2->pInJournal == (Bitvec *)0x0)) ||
         (iVar9 = sqlite3BitvecTestNotNull(pPVar2->pInJournal,i), iVar9 == 0)) {
        iVar9 = 0;
        if (i != pPVar2->lckPgno) {
          iVar9 = (*pPVar2->xGet)(pPVar2,i,&pDStack_40,0);
          if (iVar9 == 0) {
            iVar9 = pager_write(pDStack_40);
            if ((pDStack_40->flags & 8) != 0) {
              bVar5 = true;
            }
            goto LAB_00135743;
          }
          goto LAB_0013579b;
        }
      }
      else {
        pDStack_40 = sqlite3PagerLookup(pPVar2,i);
        iVar9 = 0;
        if (pDStack_40 != (DbPage *)0x0) {
          if ((pDStack_40->flags & 8) != 0) {
            bVar5 = true;
          }
LAB_00135743:
          sqlite3PagerUnrefNotNull(pDStack_40);
        }
      }
    } while ((iVar17 < iVar14) && (iVar17 = iVar17 + 1, iVar9 == 0));
    if ((iVar9 == 0) && ((bVar5 && (0 < iVar14)))) {
      do {
        pgno = pgno + 1;
        pPg_00 = sqlite3PagerLookup(pPVar2,pgno);
        if (pPg_00 != (DbPage *)0x0) {
          *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
          sqlite3PagerUnrefNotNull(pPg_00);
        }
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
  }
LAB_0013579b:
  pPVar2->doNotSpill = pPVar2->doNotSpill & 0xfb;
  return iVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}